

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_vacuum.cpp
# Opt level: O0

void __thiscall
duckdb::LogicalVacuum::LogicalVacuum
          (LogicalVacuum *this,
          unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true> *info)

{
  LogicalOperator *in_RDI;
  undefined7 in_stack_ffffffffffffffd8;
  LogicalOperatorType in_stack_ffffffffffffffdf;
  
  LogicalOperator::LogicalOperator(in_RDI,in_stack_ffffffffffffffdf);
  in_RDI->_vptr_LogicalOperator = (_func_int **)&PTR__LogicalVacuum_03518b60;
  optional_ptr<duckdb::TableCatalogEntry,_true>::optional_ptr
            ((optional_ptr<duckdb::TableCatalogEntry,_true> *)(in_RDI + 1));
  ::std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   *)0xe63521);
  unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::unique_ptr
            ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true> *)in_RDI
             ,(unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true> *)
              CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

LogicalVacuum::LogicalVacuum(unique_ptr<VacuumInfo> info)
    : LogicalOperator(LogicalOperatorType::LOGICAL_VACUUM), info(std::move(info)) {
}